

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

bool __thiscall
randomx::SuperscalarInstruction::selectDestination
          (SuperscalarInstruction *this,int cycle,bool allowChainedMul,RegisterInfo (*registers) [8]
          ,Blake2Generator *gen)

{
  byte bVar1;
  SuperscalarInstructionType SVar2;
  long in_RCX;
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  uint i;
  vector<int,_std::allocator<int>_> availableRegisters;
  value_type_conflict *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Blake2Generator *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  uint local_3c;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1130f3);
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    if ((((*(int *)(in_RCX + (ulong)local_3c * 0x10) <= in_ESI) &&
         (((*(byte *)(in_RDI + 8) & 1) != 0 || (local_3c != in_RDI[2])))) &&
        (((in_DL & 1) != 0 ||
         ((in_RDI[6] != 3 || (*(int *)(in_RCX + (ulong)local_3c * 0x10 + 4) != 3)))))) &&
       ((*(int *)(in_RCX + (ulong)local_3c * 0x10 + 4) != in_RDI[6] ||
        (*(int *)(in_RCX + (ulong)local_3c * 0x10 + 8) != in_RDI[7])))) {
      SVar2 = SuperscalarInstructionInfo::getType(*(SuperscalarInstructionInfo **)in_RDI);
      if ((SVar2 != IADD_RS) || (local_3c != 5)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
      }
    }
  }
  bVar1 = selectRegister(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool selectDestination(int cycle, bool allowChainedMul, RegisterInfo (&registers)[8], Blake2Generator& gen) {
			/*if (allowChainedMultiplication && opGroup_ == SuperscalarInstructionType::IMUL_R)
				std::cout << "Selecting destination with chained MUL enabled" << std::endl;*/
			std::vector<int> availableRegisters;
			//Conditions for the destination register:
			// * value must be ready at the required cycle
			// * cannot be the same as the source register unless the instruction allows it
			//   - this avoids optimizable instructions such as "xor r, r" or "sub r, r"
			// * register cannot be multiplied twice in a row unless allowChainedMul is true 
			//   - this avoids accumulation of trailing zeroes in registers due to excessive multiplication
			//   - allowChainedMul is set to true if an attempt to find source/destination registers failed (this is quite rare, but prevents a catastrophic failure of the generator)
			// * either the last instruction applied to the register or its source must be different than this instruction
			//   - this avoids optimizable instruction sequences such as "xor r1, r2; xor r1, r2" or "ror r, C1; ror r, C2" or "add r, C1; add r, C2"
			// * register r5 cannot be the destination of the IADD_RS instruction (limitation of the x86 lea instruction)
			for (unsigned i = 0; i < 8; ++i) {
				if (registers[i].latency <= cycle && (canReuse_ || i != src_) && (allowChainedMul || opGroup_ != SuperscalarInstructionType::IMUL_R || registers[i].lastOpGroup != SuperscalarInstructionType::IMUL_R) && (registers[i].lastOpGroup != opGroup_ || registers[i].lastOpPar != opGroupPar_) && (info_->getType() != SuperscalarInstructionType::IADD_RS || i != RegisterNeedsDisplacement))
					availableRegisters.push_back(i);
			}
			return selectRegister(availableRegisters, gen, dst_);
		}